

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O1

void __thiscall
icu_63::HebrewCalendar::handleComputeFields
          (HebrewCalendar *this,int32_t julianDay,UErrorCode *status)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int16_t (*paiVar8) [3];
  int16_t *piVar9;
  int16_t *piVar10;
  int16_t *piVar11;
  int iVar12;
  uint year;
  
  iVar7 = julianDay + -0x54f5d;
  year = (uint)(((((double)iVar7 * 25920.0) / 765433.0) * 19.0 + 234.0) / 235.0 + 1.0);
  while( true ) {
    iVar2 = startOfYear(year,status);
    iVar12 = iVar7 - iVar2;
    if (iVar12 != 0 && iVar2 <= iVar7) break;
    year = year - 1;
  }
  iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)year);
  iVar7 = iVar3 + -0x1e;
  if (iVar3 < 0x17d) {
    iVar7 = iVar3;
  }
  uVar4 = 1;
  if (iVar7 - 0x161U < 3) {
    uVar4 = (ulong)(iVar7 - 0x161U);
  }
  iVar3 = (int)(year * 0xc + 0x11) % 0x13;
  iVar7 = 0xc;
  if (iVar3 < 0) {
    iVar7 = -7;
  }
  paiVar8 = LEAP_MONTH_START;
  piVar9 = LEAP_MONTH_START[0] + uVar4;
  piVar10 = MONTH_START[0] + uVar4;
  lVar6 = 0;
  do {
    piVar11 = piVar9;
    if (iVar3 < iVar7) {
      piVar11 = piVar10;
    }
    if (iVar12 <= *piVar11) goto LAB_001e7d8b;
    lVar6 = lVar6 + 1;
    piVar9 = piVar9 + 3;
    piVar10 = piVar10 + 3;
  } while (lVar6 != 0xe);
  lVar6 = 0xe;
LAB_001e7d8b:
  if ((int)lVar6 - 0xeU < 0xfffffff3) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    uVar5 = (int)lVar6 - 1;
    if (iVar3 < iVar7) {
      paiVar8 = MONTH_START;
    }
    sVar1 = paiVar8[uVar5][uVar4];
    (this->super_Calendar).fFields[0] = 0;
    (this->super_Calendar).fStamp[0] = 1;
    (this->super_Calendar).fIsSet[0] = '\x01';
    (this->super_Calendar).fFields[1] = year;
    (this->super_Calendar).fStamp[1] = 1;
    (this->super_Calendar).fStamp[2] = 1;
    (this->super_Calendar).fIsSet[1] = '\x01';
    (this->super_Calendar).fIsSet[2] = '\x01';
    (this->super_Calendar).fFields[0x13] = year;
    (this->super_Calendar).fStamp[0x13] = 1;
    (this->super_Calendar).fIsSet[0x13] = '\x01';
    (this->super_Calendar).fFields[2] = uVar5;
    (this->super_Calendar).fFields[5] = iVar12 - sVar1;
    (this->super_Calendar).fStamp[5] = 1;
    (this->super_Calendar).fStamp[6] = 1;
    (this->super_Calendar).fIsSet[5] = '\x01';
    (this->super_Calendar).fIsSet[6] = '\x01';
    (this->super_Calendar).fFields[6] = iVar12;
  }
  return;
}

Assistant:

void HebrewCalendar::handleComputeFields(int32_t julianDay, UErrorCode &status) {
    int32_t d = julianDay - 347997;
    double m = ((d * (double)DAY_PARTS)/ (double) MONTH_PARTS);         // Months (approx)
    int32_t year = (int32_t)( ((19. * m + 234.) / 235.) + 1.);     // Years (approx)
    int32_t ys  = startOfYear(year, status);                   // 1st day of year
    int32_t dayOfYear = (d - ys);

    // Because of the postponement rules, it's possible to guess wrong.  Fix it.
    while (dayOfYear < 1) {
        year--;
        ys  = startOfYear(year, status);
        dayOfYear = (d - ys);
    }

    // Now figure out which month we're in, and the date within that month
    int32_t type = yearType(year);
    UBool isLeap = isLeapYear(year);

    int32_t month = 0;
    int32_t momax = UPRV_LENGTHOF(MONTH_START);
    while (month < momax && dayOfYear > (  isLeap ? LEAP_MONTH_START[month][type] : MONTH_START[month][type] ) ) {
        month++;
    }
    if (month >= momax || month<=0) {
        // TODO: I found dayOfYear could be out of range when
        // a large value is set to julianDay.  I patched startOfYear
        // to reduce the chace, but it could be still reproduced either
        // by startOfYear or other places.  For now, we check
        // the month is in valid range to avoid out of array index
        // access problem here.  However, we need to carefully review
        // the calendar implementation to check the extreme limit of
        // each calendar field and the code works well for any values
        // in the valid value range.  -yoshito
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    month--;
    int dayOfMonth = dayOfYear - (isLeap ? LEAP_MONTH_START[month][type] : MONTH_START[month][type]);

    internalSet(UCAL_ERA, 0);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_EXTENDED_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);       
}